

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::ShaderTextureImageSampleFunctionalTest::iterate(ShaderTextureImageSampleFunctionalTest *this)

{
  _test_type local_20;
  _test_type local_1c;
  _test_type test_type;
  uint n_test_type;
  _sampler_type sampler_type;
  uint n_sampler_type;
  ShaderTextureImageSampleFunctionalTest *this_local;
  
  _sampler_type = this;
  for (n_test_type = 0; n_test_type < 6; n_test_type = n_test_type + 1) {
    test_type = n_test_type;
    for (local_1c = TEST_TYPE_IMAGE; local_1c < TEST_TYPE_COUNT;
        local_1c = local_1c + TEST_TYPE_TEXTURE) {
      local_20 = local_1c;
      if (local_1c == *(_test_type *)&(this->super_ShaderTextureImageSamplesTestBase).field_0xa4) {
        ShaderTextureImageSamplesTestBase::executeFunctionalTest
                  (&this->super_ShaderTextureImageSamplesTestBase,&test_type,&local_20);
      }
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderTextureImageSamplesTestBase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ShaderTextureImageSampleFunctionalTest::iterate()
{
	for (unsigned int n_sampler_type = 0; n_sampler_type < SAMPLER_TYPE_COUNT; ++n_sampler_type)
	{
		_sampler_type sampler_type = (_sampler_type)n_sampler_type;

		for (unsigned int n_test_type = 0; n_test_type < TEST_TYPE_COUNT; ++n_test_type)
		{
			_test_type test_type = (_test_type)n_test_type;

			if (test_type == type_to_test)
			{
				executeFunctionalTest(sampler_type, test_type);
			}
		} /* for (all test types) */
	}	 /* for (all sampler types) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}